

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O2

void __thiscall
pybind11::array_t<unsigned_short,_16>::array_t
          (array_t<unsigned_short,_16> *this,ssize_t count,unsigned_short *ptr,handle base)

{
  _Vector_base<long,_std::allocator<long>_> local_68;
  ssize_t local_50;
  _Vector_base<long,_std::allocator<long>_> local_48;
  initializer_list<long> local_30;
  
  local_30._M_array = &local_50;
  local_30._M_len = 1;
  local_50 = count;
  detail::any_container<long>::any_container<long,void>((any_container<long> *)&local_48,&local_30);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  array::array<unsigned_short>
            (&this->super_array,(ShapeContainer *)&local_48,(StridesContainer *)&local_68,ptr,base);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_68);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

explicit array_t(ssize_t count, const T *ptr = nullptr, handle base = handle())
        : array({count}, {}, ptr, base) {}